

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

uint64_t __thiscall kaitai::kstream::read_bits_int_le(kstream *this,int n)

{
  int iVar1;
  int iVar2;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  ulong local_68;
  uint64_t mask;
  uint64_t new_bits;
  int i;
  uint8_t buf [8];
  int bytes_needed;
  int bits_needed;
  uint64_t res;
  int n_local;
  kstream *this_local;
  
  _bytes_needed = 0;
  iVar1 = n - this->m_bits_left;
  if (iVar1 < 1) {
    _bytes_needed = this->m_bits;
    this->m_bits = this->m_bits >> ((byte)n & 0x3f);
  }
  else {
    iVar2 = (iVar1 + -1) / 8 + 1;
    if (8 < iVar2) {
      this_00 = (runtime_error *)
                __cxa_allocate_exception
                          (0x10,CONCAT44(in_register_00000034,n),(long)(iVar1 + -1) % 8 & 0xffffffff
                          );
      std::runtime_error::runtime_error(this_00,"read_bits_int_le: more than 8 bytes requested");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::read((char *)this->m_io,(long)&new_bits + 4);
    for (new_bits._0_4_ = 0; (int)new_bits < iVar2; new_bits._0_4_ = (int)new_bits + 1) {
      _bytes_needed =
           (ulong)*(byte *)((long)&new_bits + (long)(int)new_bits + 4) <<
           ((byte)((int)new_bits << 3) & 0x3f) | _bytes_needed;
    }
    if (iVar1 < 0x40) {
      local_68 = _bytes_needed >> ((byte)iVar1 & 0x3f);
    }
    else {
      local_68 = 0;
    }
    _bytes_needed = _bytes_needed << ((byte)this->m_bits_left & 0x3f) | this->m_bits;
    this->m_bits = local_68;
  }
  this->m_bits_left = -iVar1 & 7;
  if (n < 0x40) {
    _bytes_needed = (1L << ((byte)n & 0x3f)) - 1U & _bytes_needed;
  }
  return _bytes_needed;
}

Assistant:

uint64_t kaitai::kstream::read_bits_int_le(int n) {
    uint64_t res = 0;
    int bits_needed = n - m_bits_left;

    if (bits_needed > 0) {
        // 1 bit  => 1 byte
        // 8 bits => 1 byte
        // 9 bits => 2 bytes
        int bytes_needed = ((bits_needed - 1) / 8) + 1; // `ceil(bits_needed / 8)`
        if (bytes_needed > 8)
            throw std::runtime_error("read_bits_int_le: more than 8 bytes requested");
        uint8_t buf[8];
        m_io->read(reinterpret_cast<char *>(buf), bytes_needed);
        for (int i = 0; i < bytes_needed; i++) {
            res |= static_cast<uint64_t>(buf[i]) << (i * 8);
        }

        // NB: for bit shift operators in C++, "if the value of the right operand is
        // negative or is greater or equal to the number of bits in the promoted left
        // operand, the behavior is undefined." (see
        // https://en.cppreference.com/w/cpp/language/operator_arithmetic#Bitwise_shift_operators)
        // So we define our desired behavior here.
        uint64_t new_bits = bits_needed < 64 ? res >> bits_needed : 0;
        res = res << m_bits_left | m_bits;
        m_bits = new_bits;
    } else {
        res = m_bits;
        m_bits >>= n;
    }

    m_bits_left = -bits_needed & 7; // `-bits_needed mod 8`

    if (n < 64) {
        uint64_t mask = (UINT64_C(1) << n) - 1;
        res &= mask;
    }
    // if `n == 64`, do nothing
    return res;
}